

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O0

int If_CutCountTotalFanins(If_Man_t *p)

{
  int iVar1;
  abctime aVar2;
  Vec_Int_t *p_00;
  If_Obj_t *pIVar3;
  If_Cut_t *pIVar4;
  If_Obj_t *pObj_00;
  abctime aVar5;
  abctime clk;
  uint local_28;
  int Counter;
  int nFaninsTotal;
  int i;
  Vec_Int_t *vLeaves;
  If_Obj_t *pObj;
  If_Man_t *p_local;
  
  local_28 = 0;
  clk._4_4_ = 0;
  aVar2 = Abc_Clock();
  p_00 = Vec_IntAlloc(100);
  for (Counter = 0; iVar1 = Vec_PtrSize(p->vObjs), Counter < iVar1; Counter = Counter + 1) {
    pIVar3 = (If_Obj_t *)Vec_PtrEntry(p->vObjs,Counter);
    iVar1 = If_ObjIsAnd(pIVar3);
    if ((iVar1 != 0) && (pIVar3->nRefs != 0)) {
      pIVar4 = If_ObjCutBest(pIVar3);
      local_28 = (*(uint *)&pIVar4->field_0x1c >> 0x18) + local_28;
      Vec_IntClear(p_00);
      pObj_00 = If_ObjFanin0(pIVar3);
      If_CutFoundFanins_rec(pObj_00,p_00);
      pIVar3 = If_ObjFanin1(pIVar3);
      If_CutFoundFanins_rec(pIVar3,p_00);
      iVar1 = Vec_IntSize(p_00);
      clk._4_4_ = iVar1 + clk._4_4_;
    }
  }
  Abc_Print(1,"Total cut inputs = %d. Total fanins incremental = %d.\n",(ulong)local_28,
            (ulong)clk._4_4_);
  aVar5 = Abc_Clock();
  Abc_PrintTime(1,"Fanins",aVar5 - aVar2);
  Vec_IntFree(p_00);
  return 1;
}

Assistant:

int If_CutCountTotalFanins( If_Man_t * p )
{
    If_Obj_t * pObj;
    Vec_Int_t * vLeaves;
    int i, nFaninsTotal = 0, Counter = 0;
    abctime clk = Abc_Clock();
    vLeaves = Vec_IntAlloc( 100 );
    If_ManForEachObj( p, pObj, i )
    {
        if ( If_ObjIsAnd(pObj) && pObj->nRefs )
        {
            nFaninsTotal += If_ObjCutBest(pObj)->nLeaves;
            Vec_IntClear( vLeaves );
            If_CutFoundFanins_rec( If_ObjFanin0(pObj), vLeaves );
            If_CutFoundFanins_rec( If_ObjFanin1(pObj), vLeaves );
            Counter += Vec_IntSize(vLeaves);
        }
    }
    Abc_Print( 1, "Total cut inputs = %d. Total fanins incremental = %d.\n", nFaninsTotal, Counter );
    Abc_PrintTime( 1, "Fanins", Abc_Clock() - clk );
    Vec_IntFree( vLeaves );
    return 1;
}